

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::IntegerDecimalCastOperation::
     HandleExponent<duckdb::IntegerDecimalCastData<short>,_true>
               (IntegerDecimalCastData<short> *state,int16_t exponent)

{
  short sVar1;
  bool bVar2;
  IntegerDecimalCastData<short> *pIVar3;
  short in_SI;
  int64_t *in_RDI;
  store_t power;
  store_t remainder;
  int16_t e;
  IntegerDecimalCastData<short> *in_stack_ffffffffffffffb8;
  long lStack_28;
  long lStack_20;
  short sStack_14;
  
  sStack_14 = in_SI;
  if (in_SI < 0) {
    while( true ) {
      sVar1 = sStack_14;
      if (*in_RDI != 0) {
        sStack_14 = sStack_14 + 1;
      }
      if (*in_RDI == 0 || -1 < sVar1) break;
      in_RDI[1] = *in_RDI % 10;
      *in_RDI = *in_RDI / 10;
    }
    if (in_RDI[1] < 0) {
      in_RDI[1] = -in_RDI[1];
    }
    *(undefined2 *)(in_RDI + 2) = 1;
    bVar2 = Finalize<duckdb::IntegerDecimalCastData<short>,_true>(in_stack_ffffffffffffffb8);
    return bVar2;
  }
  while( true ) {
    sVar1 = sStack_14;
    if (*in_RDI != 0) {
      sStack_14 = sStack_14 + -1;
    }
    if (*in_RDI == 0 || sVar1 < 1) break;
    bVar2 = TryMultiplyOperator::Operation<long,_long,_long>(*in_RDI,10,in_RDI);
    if (!bVar2) {
      return false;
    }
  }
  if (in_RDI[1] == 0) {
    bVar2 = Finalize<duckdb::IntegerDecimalCastData<short>,_true>(in_stack_ffffffffffffffb8);
    return bVar2;
  }
  sStack_14 = UnsafeNumericCast<short,_int,_void>((int)in_SI - (uint)*(ushort *)(in_RDI + 2));
  lStack_20 = 0;
  if (sStack_14 < 0) {
    in_stack_ffffffffffffffb8 = (IntegerDecimalCastData<short> *)(ulong)(-(int)sStack_14 & 0xffff);
    pIVar3 = (IntegerDecimalCastData<short> *)NumericLimits<long>::Digits();
    if (pIVar3 < in_stack_ffffffffffffffb8) {
      in_RDI[1] = 0;
    }
    else {
      lStack_28 = 1;
      while (sStack_14 < 0) {
        lStack_28 = lStack_28 * 10;
        sStack_14 = sStack_14 + 1;
      }
      lStack_20 = in_RDI[1] % lStack_28;
      in_RDI[1] = in_RDI[1] / lStack_28;
    }
  }
  else {
    while (0 < sStack_14) {
      bVar2 = TryMultiplyOperator::Operation<long,_long,_long>(in_RDI[1],10,in_RDI + 1);
      sStack_14 = sStack_14 + -1;
      if (!bVar2) {
        return false;
      }
    }
  }
  *(short *)(in_RDI + 2) = (short)in_RDI[2] - in_SI;
  bVar2 = TrySubtractOperator::Operation<long,_long,_long>(*in_RDI,in_RDI[1],in_RDI);
  if (!bVar2) {
    return false;
  }
  in_RDI[1] = lStack_20;
  bVar2 = Finalize<duckdb::IntegerDecimalCastData<short>,_true>(in_stack_ffffffffffffffb8);
  return bVar2;
}

Assistant:

static bool HandleExponent(T &state, int16_t exponent) {
		using store_t = typename T::StoreType;

		int16_t e = exponent;
		// Negative Exponent
		if (e < 0) {
			while (state.result != 0 && e++ < 0) {
				state.decimal = state.result % 10;
				state.result /= 10;
			}
			if (state.decimal < 0) {
				state.decimal = -state.decimal;
			}
			state.decimal_digits = 1;
			return Finalize<T, NEGATIVE>(state);
		}

		// Positive Exponent
		while (state.result != 0 && e-- > 0) {
			if (!TryMultiplyOperator::Operation(state.result, (store_t)10, state.result)) {
				return false;
			}
		}

		if (state.decimal == 0) {
			return Finalize<T, NEGATIVE>(state);
		}

		// Handle decimals
		e = UnsafeNumericCast<int16_t>(exponent - state.decimal_digits);
		store_t remainder = 0;
		if (e < 0) {
			if (static_cast<uint16_t>(-e) <= NumericLimits<store_t>::Digits()) {
				store_t power = 1;
				while (e++ < 0) {
					power *= 10;
				}
				remainder = state.decimal % power;
				state.decimal /= power;
			} else {
				state.decimal = 0;
			}
		} else {
			while (e-- > 0) {
				if (!TryMultiplyOperator::Operation(state.decimal, (store_t)10, state.decimal)) {
					return false;
				}
			}
		}

		state.decimal_digits -= exponent;

		if (NEGATIVE) {
			if (!TrySubtractOperator::Operation(state.result, state.decimal, state.result)) {
				return false;
			}
		} else if (!TryAddOperator::Operation(state.result, state.decimal, state.result)) {
			return false;
		}
		state.decimal = remainder;
		return Finalize<T, NEGATIVE>(state);
	}